

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.h
# Opt level: O2

CustomAttribute
winmd::reader::get_attribute<winmd::reader::InterfaceImpl>
          (InterfaceImpl *row,string_view *type_namespace,string_view *type_name)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  undefined8 uVar1;
  bool bVar2;
  uint32_t uVar3;
  ulong uVar4;
  CustomAttribute CVar5;
  CustomAttribute __begin0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  pair;
  CustomAttribute local_88;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_70;
  pair<winmd::reader::CustomAttribute,_winmd::reader::CustomAttribute> local_50;
  
  InterfaceImpl::CustomAttribute(&local_50,row);
  local_88.super_row_base<winmd::reader::CustomAttribute>.m_table =
       local_50.first.super_row_base<winmd::reader::CustomAttribute>.m_table;
  local_88.super_row_base<winmd::reader::CustomAttribute>.m_index =
       local_50.first.super_row_base<winmd::reader::CustomAttribute>.m_index;
  local_88.super_row_base<winmd::reader::CustomAttribute>._12_4_ =
       local_50.first.super_row_base<winmd::reader::CustomAttribute>._12_4_;
  uVar1 = local_88.super_row_base<winmd::reader::CustomAttribute>._8_8_;
  local_88.super_row_base<winmd::reader::CustomAttribute>.m_index =
       local_50.first.super_row_base<winmd::reader::CustomAttribute>.m_index;
  uVar3 = local_88.super_row_base<winmd::reader::CustomAttribute>.m_index;
  local_88.super_row_base<winmd::reader::CustomAttribute>._8_8_ = uVar1;
  while ((local_88.super_row_base<winmd::reader::CustomAttribute>.m_table !=
          local_50.second.super_row_base<winmd::reader::CustomAttribute>.m_table ||
         (uVar3 != local_50.second.super_row_base<winmd::reader::CustomAttribute>.m_index))) {
    CustomAttribute::TypeNamespaceAndName(&local_70,&local_88);
    __y._M_len = type_namespace->_M_len;
    __y._M_str = type_namespace->_M_str;
    bVar2 = std::operator==(local_70.first,__y);
    if (bVar2) {
      __y_00._M_len = type_name->_M_len;
      __y_00._M_str = type_name->_M_str;
      bVar2 = std::operator==(local_70.second,__y_00);
      if (bVar2) {
        uVar4 = local_88.super_row_base<winmd::reader::CustomAttribute>._8_8_ & 0xffffffff;
LAB_00140ad3:
        CVar5.super_row_base<winmd::reader::CustomAttribute>._8_8_ = uVar4;
        CVar5.super_row_base<winmd::reader::CustomAttribute>.m_table =
             local_88.super_row_base<winmd::reader::CustomAttribute>.m_table;
        return (CustomAttribute)CVar5.super_row_base<winmd::reader::CustomAttribute>;
      }
    }
    uVar3 = local_88.super_row_base<winmd::reader::CustomAttribute>.m_index + 1;
    local_88.super_row_base<winmd::reader::CustomAttribute>.m_index = uVar3;
  }
  uVar4 = 0;
  local_88.super_row_base<winmd::reader::CustomAttribute>.m_table = (table_base *)0x0;
  goto LAB_00140ad3;
}

Assistant:

CustomAttribute get_attribute(T const& row, std::string_view const& type_namespace, std::string_view const& type_name)
    {
        for (auto&& attribute : row.CustomAttribute())
        {
            auto pair = attribute.TypeNamespaceAndName();

            if (pair.first == type_namespace && pair.second == type_name)
            {
                return attribute;
            }
        }

        return {};
    }